

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O0

void __thiscall LastVal<IntVar,_int>::LastVal(LastVal<IntVar,_int> *this,IntVar *_x,int *_v)

{
  undefined8 in_RDX;
  _func_int **in_RSI;
  Propagator *in_RDI;
  
  Propagator::Propagator(in_RDI);
  in_RDI->_vptr_Propagator = (_func_int **)&PTR__LastVal_0031ee68;
  in_RDI[1]._vptr_Propagator = in_RSI;
  in_RDI[1].prop_id = (int)in_RDX;
  in_RDI[1].priority = (int)((ulong)in_RDX >> 0x20);
  in_RDI->priority = 0;
  (**(code **)(*in_RDI[1]._vptr_Propagator + 0x38))(in_RDI[1]._vptr_Propagator,in_RDI,0,8);
  return;
}

Assistant:

LastVal(Var* _x, Val* _v) : x(_x), v(_v) {
		priority = 0;
		x->attach(this, 0, EVENT_F);
	}